

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointerKernel(Instruction *this)

{
  uint32_t uVar1;
  Op OVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  StorageClass storage_class;
  Instruction *type_def;
  Instruction *this_local;
  
  uVar1 = type_id(this);
  if (uVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = context(this);
    this_01 = IRContext::get_def_use_mgr(this_00);
    uVar1 = type_id(this);
    this_02 = analysis::DefUseManager::GetDef(this_01,uVar1);
    OVar2 = opcode(this_02);
    if (OVar2 == OpTypePointer) {
      uVar1 = GetSingleWordInOperand(this_02,0);
      this_local._7_1_ = uVar1 == 0;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsReadOnlyPointerKernel() const {
  if (type_id() == 0) {
    return false;
  }

  Instruction* type_def = context()->get_def_use_mgr()->GetDef(type_id());
  if (type_def->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class = spv::StorageClass(
      type_def->GetSingleWordInOperand(kPointerTypeStorageClassIndex));

  return storage_class == spv::StorageClass::UniformConstant;
}